

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fair_mutex.hpp
# Opt level: O2

bool __thiscall
yamc::fair::detail::timed_mutex_impl::
impl_try_lockwait<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
          (timed_mutex_impl *this,unique_lock<std::mutex> *lk,
          time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          *tp)

{
  node *pnVar1;
  cv_status cVar2;
  node request;
  node local_38;
  
  if ((timed_mutex_impl *)(this->queue_).next == this) {
    pnVar1 = (this->queue_).prev;
    (this->queue_).prev = &this->locked_;
    pnVar1->next = &this->locked_;
    (this->locked_).next = &this->queue_;
    (this->locked_).prev = pnVar1;
  }
  else {
    local_38.prev = (this->queue_).prev;
    (this->queue_).prev = &local_38;
    (local_38.prev)->next = &local_38;
    local_38.next = &this->queue_;
    do {
      if ((this->queue_).next == &local_38) goto LAB_00119004;
      cVar2 = std::condition_variable::
              __wait_until_impl<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                        (&this->cv_,lk,tp);
    } while (cVar2 != timeout);
    if ((this->queue_).next != &local_38) {
      ((node *)&(local_38.next)->next)->prev = local_38.prev;
      (local_38.prev)->next = local_38.next;
      return false;
    }
LAB_00119004:
    wq_replace_front(this,&this->locked_);
  }
  return true;
}

Assistant:

bool impl_try_lockwait(std::unique_lock<std::mutex>& lk, const std::chrono::time_point<Clock, Duration>& tp)
  {
    if (!wq_empty()) {
      node request;
      wq_push_back(&request);
      while (queue_.next != &request) {
        if (cv_.wait_until(lk, tp) == std::cv_status::timeout) {
          if (queue_.next == &request)  // re-check predicate
            break;
          wq_erase(&request);
          return false;
        }
      }
      wq_replace_front(&locked_);
    } else {
      wq_push_back(&locked_);
    }
    return true;
  }